

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O0

void DrawStatLine(int x,int *y,char *prefix,char *string)

{
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  int iVar3;
  char *string_local;
  char *prefix_local;
  int *y_local;
  int x_local;
  
  iVar3 = FFont::GetHeight(SmallFont);
  *y = *y - (iVar3 + -1);
  pDVar2 = screen;
  pFVar1 = SmallFont;
  iVar3 = FIntCVar::operator_cast_to_int(&hudcolor_statnames);
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,iVar3,x,*y,prefix,0x400013a8,1,0x40001399,hudwidth,
                    0x4000139a,hudheight,0x4000138b,0xc000,0);
  pDVar2 = screen;
  pFVar1 = SmallFont;
  iVar3 = FIntCVar::operator_cast_to_int(&hudcolor_stats);
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,iVar3,x + statspace,*y,string,0x400013a8,1,0x40001399,
                    hudwidth,0x4000139a,hudheight,0x4000138b,0xc000,0);
  return;
}

Assistant:

static void DrawStatLine(int x, int &y, const char *prefix, const char *string)
{
	y -= SmallFont->GetHeight()-1;
	screen->DrawText(SmallFont, hudcolor_statnames, x, y, prefix, 
		DTA_KeepRatio, true,
		DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, 0xc000, TAG_DONE);

	screen->DrawText(SmallFont, hudcolor_stats, x+statspace, y, string,
		DTA_KeepRatio, true,
		DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, 0xc000, TAG_DONE);
}